

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O1

void __thiscall
absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FileDescriptorProto>::
~StatusOrData(StatusOrData<google::protobuf::FileDescriptorProto> *this)

{
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FileDescriptorProto>_1 this_00;
  
  this_00 = this->field_0;
  if (this_00 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FileDescriptorProto>_1)0x1) {
    google::protobuf::FileDescriptorProto::~FileDescriptorProto(&(this->field_1).data_);
    return;
  }
  if (((ulong)this_00 & 1) == 0) {
    status_internal::StatusRep::Unref((StatusRep *)this_00);
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }